

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O0

string * __thiscall
cmCTestCurl::Escape(string *__return_storage_ptr__,cmCTestCurl *this,string *source)

{
  CURL *handle;
  char *pcVar1;
  allocator local_2a;
  undefined1 local_29;
  char *local_28;
  char *data1;
  string *source_local;
  cmCTestCurl *this_local;
  string *ret;
  
  handle = this->Curl;
  data1 = (char *)source;
  source_local = (string *)this;
  this_local = (cmCTestCurl *)__return_storage_ptr__;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = curl_easy_escape(handle,pcVar1,0);
  local_29 = 0;
  local_28 = pcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  curl_free(local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestCurl::Escape(std::string const& source)
{
  char* data1 = curl_easy_escape(this->Curl, source.c_str(), 0);
  std::string ret = data1;
  curl_free(data1);
  return ret;
}